

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O2

void __thiscall nuraft::snapshot_io_mgr::async_io_loop(snapshot_io_mgr *this)

{
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  *__x;
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  long *plVar5;
  ulong offset;
  element_type *peVar6;
  ulong uVar7;
  ulong uVar8;
  long *plVar9;
  peer *this_00;
  raft_server *prVar10;
  element_type *peVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  pthread_t __target_thread;
  __uniq_ptr_data<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>,_true,_true>
  this_01;
  iterator iVar15;
  _List_node_base *p_Var16;
  _List_node_base *p_Var17;
  void **ppvVar18;
  const_iterator __position;
  bool is_last_request;
  int dst_id;
  int local_14c;
  lock_guard<std::mutex> guard;
  unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_> sync_req;
  undefined1 local_128 [16];
  unique_lock<std::recursive_mutex> guard_2;
  ptr<buffer> data;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  reqs_to_return;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  reqs;
  ptr<req_msg> req;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_90;
  ulong commit_idx;
  ulong term;
  unique_lock<std::mutex> lock;
  unique_lock<std::recursive_mutex> guard_1;
  string thread_name;
  
  std::__cxx11::string::string((string *)&thread_name,"nuraft_snp_io",(allocator *)&guard_2);
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,thread_name._M_dataplus._M_p);
  guard._M_device = &this->queue_lock_;
  __x = &this->queue_;
  do {
    p_Var16 = (_List_node_base *)&reqs;
    EventAwaiter::wait_us
              ((this->io_thread_ea_).
               super___shared_ptr<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1000000);
    LOCK();
    (((this->io_thread_ea_).super___shared_ptr<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->status)._M_i = idle;
    UNLOCK();
    reqs.
    super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = p_Var16;
    reqs.
    super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = p_Var16;
    reqs.
    super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ._M_impl._M_node._M_size = 0;
    reqs_to_return.
    super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&reqs_to_return;
    reqs_to_return.
    super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&reqs_to_return;
    reqs_to_return.
    super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ._M_impl._M_node._M_size = 0;
    if (((this->terminating_)._M_base._M_i & 1U) == 0) {
      std::mutex::lock(guard._M_device);
      std::__cxx11::
      list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
      ::operator=((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                   *)p_Var16,__x);
      pthread_mutex_unlock((pthread_mutex_t *)guard._M_device);
    }
    while( true ) {
      p_Var16 = (((_List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                   *)&p_Var16->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if ((p_Var16 == (_List_node_base *)&reqs) || (((this->terminating_)._M_base._M_i & 1U) != 0))
      break;
      p_Var17 = p_Var16 + 1;
      peVar1 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2> *
                 )&p_Var17->_M_next)->_M_ptr->raft_).
               super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((peVar1->leader_).super___atomic_base<int>._M_i != peVar1->id_) ||
         ((peVar1->role_)._M_i != leader)) break;
      peVar2 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2> *
                 )&p_Var17->_M_next)->_M_ptr->dst_).
               super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      dst_id = ((peVar2->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->id_;
      std::unique_lock<std::mutex>::unique_lock(&lock,&peVar2->lock_);
      peVar3 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2> *)
               &p_Var17->_M_next)->_M_ptr;
      peVar4 = (peVar3->sync_ctx_).
               super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      plVar5 = (long *)(((peVar3->raft_).
                         super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      offset = (peVar4->field_2).offset_;
      ppvVar18 = &peVar4->user_snp_ctx_;
      if ((plVar5 != (long *)0x0) && (iVar13 = (**(code **)(*plVar5 + 0x38))(plVar5), 4 < iVar13)) {
        msg_if_given_abi_cxx11_
                  ((string *)&guard_2,"peer: %d, obj_idx: %lu, user_snp_ctx %p",(ulong)(uint)dst_id,
                   offset,*ppvVar18);
        (**(code **)(*plVar5 + 0x40))
                  (plVar5,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                   ,"async_io_loop",0xb8,(string *)&guard_2);
        std::__cxx11::string::~string((string *)&guard_2);
      }
      peVar6 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2> *
                 )&p_Var17->_M_next)->_M_ptr->snapshot_).
               super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar7 = peVar6->last_log_idx_;
      uVar8 = peVar6->last_log_term_;
      std::unique_lock<std::mutex>::unlock(&lock);
      data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      is_last_request = false;
      peVar3 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2> *)
               &p_Var17->_M_next)->_M_ptr;
      plVar9 = (long *)(((peVar3->raft_).
                         super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->state_machine_).
                       super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar14 = (**(code **)(*plVar9 + 0x70))
                         (plVar9,(peVar3->snapshot_).
                                 super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,ppvVar18,offset,&data,&is_last_request);
      if ((int)uVar14 < 0) {
        if ((plVar5 != (long *)0x0) && (iVar13 = (**(code **)(*plVar5 + 0x38))(), 2 < iVar13)) {
          msg_if_given_abi_cxx11_
                    ((string *)&guard_2,
                     "reading snapshot (idx %lu, term %lu, object %lu) for peer %d failed: %d",uVar7
                     ,uVar8,offset,(ulong)(uint)dst_id,(ulong)uVar14);
          (**(code **)(*plVar5 + 0x40))
                    (plVar5,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                     ,"async_io_loop",0xca,&guard_2);
          std::__cxx11::string::~string((string *)&guard_2);
        }
        std::unique_lock<std::recursive_mutex>::unique_lock
                  (&guard_2,&((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                 *)&p_Var17->_M_next)->_M_ptr->raft_).
                              super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->lock_);
        iVar15 = std::
                 _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                              *)&p_Var17->_M_next)->_M_ptr->raft_).
                           super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->peers_)._M_h,&dst_id);
        peVar3 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                   *)&p_Var17->_M_next)->_M_ptr;
        prVar10 = (peVar3->raft_).
                  super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (iVar15.
            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
            _M_cur == (__node_type *)0x0) {
          LOCK();
          (prVar10->srv_to_join_snp_retry_required_)._M_base._M_i = true;
          UNLOCK();
          prVar10 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                       *)&p_Var17->_M_next)->_M_ptr->raft_).
                    super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          raft_server::enable_hb_for_peer
                    (prVar10,(prVar10->srv_to_join_).
                             super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        else {
          raft_server::clear_snapshot_sync_ctx
                    (prVar10,(peVar3->dst_).
                             super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&guard_2);
      }
      else {
        if (data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          buffer::pos(data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
        }
        std::unique_lock<std::recursive_mutex>::unique_lock
                  (&guard_1,&((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                 *)&p_Var17->_M_next)->_M_ptr->raft_).
                              super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->lock_);
        term = *(ulong *)((long)(((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                     *)&p_Var17->_M_next)->_M_ptr->raft_).
                                  super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->state_).
                                super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 8);
        commit_idx = (((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                          *)&p_Var17->_M_next)->_M_ptr->raft_).
                       super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
        this_01.
        super___uniq_ptr_impl<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
        ._M_t.
        super__Tuple_impl<0UL,_nuraft::snapshot_sync_req_*,_std::default_delete<nuraft::snapshot_sync_req>_>
        .super__Head_base<0UL,_nuraft::snapshot_sync_req_*,_false>._M_head_impl =
             (__uniq_ptr_impl<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
              )operator_new(0x30);
        snapshot_sync_req::snapshot_sync_req
                  ((snapshot_sync_req *)
                   this_01.
                   super___uniq_ptr_impl<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_nuraft::snapshot_sync_req_*,_std::default_delete<nuraft::snapshot_sync_req>_>
                   .super__Head_base<0UL,_nuraft::snapshot_sync_req_*,_false>._M_head_impl,
                   &((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                      *)&p_Var17->_M_next)->_M_ptr->snapshot_,offset,&data,is_last_request);
        local_14c = 0x10;
        peVar3 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                   *)&p_Var17->_M_next)->_M_ptr;
        peVar6 = (peVar3->snapshot_).
                 super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        guard_2._M_device = (mutex_type *)peVar6->last_log_term_;
        local_128._0_8_ = peVar6->last_log_idx_;
        sync_req._M_t.
        super___uniq_ptr_impl<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
        ._M_t.
        super__Tuple_impl<0UL,_nuraft::snapshot_sync_req_*,_std::default_delete<nuraft::snapshot_sync_req>_>
        .super__Head_base<0UL,_nuraft::snapshot_sync_req_*,_false>._M_head_impl =
             (__uniq_ptr_data<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>,_true,_true>
              )(__uniq_ptr_data<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>,_true,_true>
                )this_01.
                 super___uniq_ptr_impl<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_nuraft::snapshot_sync_req_*,_std::default_delete<nuraft::snapshot_sync_req>_>
                 .super__Head_base<0UL,_nuraft::snapshot_sync_req_*,_false>._M_head_impl;
        std::
        make_shared<nuraft::req_msg,unsigned_long&,nuraft::msg_type,int&,int&,unsigned_long,unsigned_long,unsigned_long&>
                  ((unsigned_long *)&req,(msg_type *)&term,&local_14c,
                   &((peVar3->raft_).
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    id_,(unsigned_long *)&dst_id,(unsigned_long *)&guard_2,
                   (unsigned_long *)local_128);
        peVar11 = req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        snapshot_sync_req::serialize((snapshot_sync_req *)local_128);
        local_14c = CONCAT31(local_14c._1_3_,5);
        std::
        make_shared<nuraft::log_entry,unsigned_long&,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                  ((unsigned_long *)&guard_2,(shared_ptr<nuraft::buffer> *)&term,
                   (log_val_type *)local_128);
        std::
        vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
        ::emplace_back<std::shared_ptr<nuraft::log_entry>>
                  ((vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
                    *)&peVar11->log_entries_,(shared_ptr<nuraft::log_entry> *)&guard_2);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&guard_2._M_owns);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
        bVar12 = peer::make_busy((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                    *)&p_Var17->_M_next)->_M_ptr->dst_).
                                 super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                );
        if (bVar12) {
          local_128._0_8_ = (element_type *)0x0;
          local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          guard_2._M_device = (mutex_type *)0x0;
          guard_2._M_owns = false;
          guard_2._9_7_ = 0;
          peer::set_rsv_msg((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                               *)&p_Var17->_M_next)->_M_ptr->dst_).
                            super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (ptr<req_msg> *)local_128,(rpc_handler *)&guard_2);
          std::_Function_base::~_Function_base((_Function_base *)&guard_2);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
          peVar3 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                     *)&p_Var17->_M_next)->_M_ptr;
          this_00 = (peVar3->dst_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_90,
                     &(peVar3->dst_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
          peer::send_req(this_00,(ptr<peer> *)&local_90,&req,
                         &((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                            *)&p_Var17->_M_next)->_M_ptr->handler_);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
          timer_helper::reset(&((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                   *)&p_Var17->_M_next)->_M_ptr->dst_).
                                super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->last_sent_timer_);
          if ((plVar5 != (long *)0x0) &&
             (iVar13 = (**(code **)(*plVar5 + 0x38))(plVar5), 5 < iVar13)) {
            msg_if_given_abi_cxx11_
                      ((string *)&guard_2,"bg thread sent message to peer %d",(ulong)(uint)dst_id);
            (**(code **)(*plVar5 + 0x40))
                      (plVar5,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                       ,"async_io_loop",0xf5,(string *)&guard_2);
            std::__cxx11::string::~string((string *)&guard_2);
          }
        }
        else {
          if ((plVar5 != (long *)0x0) &&
             (iVar13 = (**(code **)(*plVar5 + 0x38))(plVar5), 4 < iVar13)) {
            msg_if_given_abi_cxx11_
                      ((string *)&guard_2,"peer %d is busy, push the request back to queue",
                       (ulong)(uint)dst_id);
            (**(code **)(*plVar5 + 0x40))
                      (plVar5,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                       ,"async_io_loop",0xf8,(string *)&guard_2);
            std::__cxx11::string::~string((string *)&guard_2);
          }
          std::__cxx11::
          list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
          ::push_back(&reqs_to_return,(value_type *)p_Var17);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
        ::~unique_ptr(&sync_req);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&guard_1);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&data.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::unique_lock<std::mutex>::~unique_lock(&lock);
    }
    std::mutex::lock(guard._M_device);
    p_Var16 = (_List_node_base *)&reqs;
LAB_001cc8de:
    p_Var16 = p_Var16->_M_next;
    p_Var17 = (_List_node_base *)
              &reqs_to_return.
               super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ;
    __position._M_node = (_List_node_base *)__x;
    if (p_Var16 != (_List_node_base *)&reqs) {
      do {
        __position._M_node = (__position._M_node)->_M_next;
        if (__position._M_node == (_List_node_base *)__x) goto LAB_001cc8de;
      } while (__position._M_node[1]._M_next != p_Var16[1]._M_next);
      std::__cxx11::
      list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
      ::erase(__x,__position);
      goto LAB_001cc8de;
    }
    while (p_Var17 = (((_List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                        *)p_Var17)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var17 !=
          (_List_node_base *)
          &reqs_to_return.
           super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
          ) {
      std::__cxx11::
      list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
      ::push_back(__x,(value_type *)(p_Var17 + 1));
    }
    pthread_mutex_unlock((pthread_mutex_t *)guard._M_device);
    std::__cxx11::
    _List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ::_M_clear(&reqs_to_return.
                super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
              );
    std::__cxx11::
    _List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ::_M_clear((_List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                *)&reqs);
    if (((this->terminating_)._M_base._M_i & 1U) != 0) {
      std::__cxx11::string::~string((string *)&thread_name);
      return;
    }
  } while( true );
}

Assistant:

void snapshot_io_mgr::async_io_loop() {
    std::string thread_name = "nuraft_snp_io";
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    do {
        io_thread_ea_->wait_ms(1000);
        io_thread_ea_->reset();

        std::list< ptr<io_queue_elem> > reqs;
        std::list< ptr<io_queue_elem> > reqs_to_return;
        if (!terminating_) {
            auto_lock(queue_lock_);
            reqs = queue_;
        }

        for (ptr<io_queue_elem>& elem: reqs) {
            if (terminating_) {
                break;
            }
            if (!elem->raft_->is_leader()) {
                break;
            }

            int dst_id = elem->dst_->get_id();

            std::unique_lock<std::mutex> lock(elem->dst_->get_lock());
            // ---- lock acquired
            logger* l_ = elem->raft_->l_.get();
            ulong obj_idx = elem->sync_ctx_->get_offset();
            void*& user_snp_ctx = elem->sync_ctx_->get_user_snp_ctx();
            p_db("peer: %d, obj_idx: %" PRIu64 ", user_snp_ctx %p",
                 dst_id, obj_idx, user_snp_ctx);

            ulong snp_log_idx = elem->snapshot_->get_last_log_idx();
            ulong snp_log_term = elem->snapshot_->get_last_log_term();
            // ---- lock released
            lock.unlock();

            ptr<buffer> data = nullptr;
            bool is_last_request = false;

            int rc = elem->raft_->state_machine_->read_logical_snp_obj
                     ( *elem->snapshot_, user_snp_ctx, obj_idx,
                       data, is_last_request );
            if (rc < 0) {
                // Snapshot read failed.
                p_wn( "reading snapshot (idx %" PRIu64 ", term %" PRIu64
                      ", object %" PRIu64 ") "
                      "for peer %d failed: %d",
                      snp_log_idx, snp_log_term, obj_idx, dst_id, rc );

                recur_lock(elem->raft_->lock_);
                auto entry = elem->raft_->peers_.find(dst_id);
                if (entry != elem->raft_->peers_.end()) {
                    // If normal member (already in the peer list):
                    //   reset the `sync_ctx` so as to retry with the newer version.
                    elem->raft_->clear_snapshot_sync_ctx(*elem->dst_);
                } else {
                    // If it is joing the server (not in the peer list),
                    // enable HB temporarily to retry the request.
                    elem->raft_->srv_to_join_snp_retry_required_ = true;
                    elem->raft_->enable_hb_for_peer(*elem->raft_->srv_to_join_);
                }

                continue;
            }
            if (data) data->pos(0);

            // Send snapshot message with the given response handler.
            recur_lock(elem->raft_->lock_);
            ulong term = elem->raft_->state_->get_term();
            ulong commit_idx = elem->raft_->quick_commit_index_;

            std::unique_ptr<snapshot_sync_req> sync_req(
                new snapshot_sync_req( elem->snapshot_, obj_idx,
                                       data, is_last_request ) );
            ptr<req_msg> req( cs_new<req_msg>
                              ( term,
                                msg_type::install_snapshot_request,
                                elem->raft_->id_,
                                dst_id,
                                elem->snapshot_->get_last_log_term(),
                                elem->snapshot_->get_last_log_idx(),
                                commit_idx ) );
            req->log_entries().push_back( cs_new<log_entry>
                                          ( term,
                                            sync_req->serialize(),
                                            log_val_type::snp_sync_req ) );
            if (elem->dst_->make_busy()) {
                elem->dst_->set_rsv_msg(nullptr, nullptr);
                elem->dst_->send_req(elem->dst_, req, elem->handler_);
                elem->dst_->reset_ls_timer();
                p_tr("bg thread sent message to peer %d", dst_id);

            } else {
                p_db("peer %d is busy, push the request back to queue", dst_id);
                reqs_to_return.push_back(elem);
            }
        }

        {
            auto_lock(queue_lock_);
            // Remove elements in `reqs` from `queue_`.
            for (auto& entry: reqs) {
                auto e2 = queue_.begin();
                while (e2 != queue_.end()) {
                    if (*e2 == entry) {
                        e2 = queue_.erase(e2);
                        break;
                    } else {
                        e2++;
                    }
                }
            }
            // Return elements in `reqs_to_return` to `queue_` for retrying.
            for (auto& entry: reqs_to_return) {
                queue_.push_back(entry);
            }
        }

    } while (!terminating_);
}